

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

HashElem * findElementWithHash(Hash *pH,char *pKey,uint *pHash)

{
  _ht *p_Var1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Hash *pHVar6;
  HashElem *pHVar7;
  HashElem *pHVar8;
  bool bVar9;
  
  p_Var1 = pH->ht;
  if (p_Var1 == (_ht *)0x0) {
    pHVar6 = (Hash *)&pH->count;
    uVar3 = 0;
  }
  else {
    uVar3 = strHash(pKey);
    uVar2 = (ulong)uVar3 % (ulong)pH->htsize;
    uVar3 = (uint)uVar2;
    pHVar6 = (Hash *)(p_Var1 + uVar2);
    pH = pHVar6;
  }
  uVar5 = pHVar6->htsize;
  pHVar8 = pH->first;
  if (pHash != (uint *)0x0) {
    *pHash = uVar3;
  }
  while ((bVar9 = uVar5 != 0, uVar5 = uVar5 - 1, pHVar7 = &findElementWithHash::nullElement, bVar9
         && (iVar4 = sqlite3StrICmp(pHVar8->pKey,pKey), pHVar7 = pHVar8, iVar4 != 0))) {
    pHVar8 = pHVar8->next;
  }
  return pHVar7;
}

Assistant:

static HashElem *findElementWithHash(
  const Hash *pH,     /* The pH to be searched */
  const char *pKey,   /* The key we are searching for */
  unsigned int *pHash /* Write the hash value here */
){
  HashElem *elem;                /* Used to loop thru the element list */
  int count;                     /* Number of elements left to test */
  unsigned int h;                /* The computed hash */
  static HashElem nullElement = { 0, 0, 0, 0 };

  if( pH->ht ){   /*OPTIMIZATION-IF-TRUE*/
    struct _ht *pEntry;
    h = strHash(pKey) % pH->htsize;
    pEntry = &pH->ht[h];
    elem = pEntry->chain;
    count = pEntry->count;
  }else{
    h = 0;
    elem = pH->first;
    count = pH->count;
  }
  if( pHash ) *pHash = h;
  while( count-- ){
    assert( elem!=0 );
    if( sqlite3StrICmp(elem->pKey,pKey)==0 ){ 
      return elem;
    }
    elem = elem->next;
  }
  return &nullElement;
}